

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O0

void decryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  u64b_t uVar1;
  uint64_t num_blocks_local;
  uint64_t *plain_text_local;
  uint64_t *chain_local;
  ThreefishKey_t *key_local;
  
  uVar1 = key->stateSize;
  if (uVar1 == 0x100) {
    cbc256Decrypt(key,chain,plain_text,num_blocks);
  }
  else if (uVar1 == 0x200) {
    cbc512Decrypt(key,chain,plain_text,num_blocks);
  }
  else {
    if (uVar1 != 0x400) {
      perror("Invalid state size cannot continue\n");
      exit(9);
    }
    cbc1024Decrypt(key,chain,plain_text,num_blocks);
  }
  return;
}

Assistant:

void decryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("decryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Decrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}